

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O0

void __thiscall BitmapResult::writeRGB(BitmapResult *this,FILE *file,png_bytepp rows)

{
  ushort uVar1;
  ushort local_42;
  byte *pbStack_40;
  uint16_t pixel;
  png_bytep p;
  png_byte *ppStack_30;
  uint32_t x;
  png_bytep row;
  png_bytepp pppStack_20;
  uint32_t y;
  png_bytepp rows_local;
  FILE *file_local;
  BitmapResult *this_local;
  
  pppStack_20 = rows;
  rows_local = (png_bytepp)file;
  file_local = (FILE *)this;
  for (row._4_4_ = 0; row._4_4_ < this->m_height; row._4_4_ = row._4_4_ + 1) {
    ppStack_30 = pppStack_20[row._4_4_];
    for (p._4_4_ = 0; p._4_4_ < this->m_width; p._4_4_ = p._4_4_ + 1) {
      pbStack_40 = ppStack_30 + (p._4_4_ << 2);
      uVar1 = (ushort)(*pbStack_40 / 8 << 0xb) | (ushort)(pbStack_40[1] / 8 << 6);
      local_42 = uVar1 >> 8 | (uVar1 | pbStack_40[2] / 8) << 8;
      fwrite(&local_42,2,1,(FILE *)rows_local);
    }
  }
  return;
}

Assistant:

void BitmapResult::writeRGB(FILE *file, png_bytepp rows){
    for(uint32_t y=0;y<m_height;y++){
        png_bytep row = rows[y];
        for(uint32_t x=0;x<m_width;x++){
            png_bytep p = &row[x*4];
            uint16_t pixel = 0;
            //What the fuck! Why is the endianness flipped? Honestly, just shoot me at this point
            pixel |= ((uint16_t)(p[0]/8)) <<11; //r
            pixel |= ((uint16_t)(p[1]/8)) <<6; //g
            pixel |= ((uint16_t)(p[2]/8)) <<0; //b
            //there is no alpha value, duh
            pixel = ((pixel&0xff00)>>8)|((pixel&0x00ff)<<8); //flip endianness
            fwrite(&pixel,2,1,file);
        }
    }
}